

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_udp.c
# Opt level: O0

int nni_plat_udp_sockname(nni_plat_udp *udp,nni_sockaddr *sa)

{
  int iVar1;
  int *piVar2;
  socklen_t local_a4;
  undefined1 local_a0 [4];
  socklen_t sz;
  sockaddr_storage ss;
  nni_sockaddr *sa_local;
  nni_plat_udp *udp_local;
  
  local_a4 = 0x80;
  ss.__ss_align = (unsigned_long)sa;
  iVar1 = getsockname(udp->udp_fd,(sockaddr *)local_a0,&local_a4);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    udp_local._4_4_ = nni_plat_errno(*piVar2);
  }
  else {
    udp_local._4_4_ = nni_posix_sockaddr2nn((nni_sockaddr *)ss.__ss_align,local_a0,(ulong)local_a4);
  }
  return udp_local._4_4_;
}

Assistant:

int
nni_plat_udp_sockname(nni_plat_udp *udp, nni_sockaddr *sa)
{
	struct sockaddr_storage ss;
	socklen_t               sz;

	sz = sizeof(ss);
	if (getsockname(udp->udp_fd, (struct sockaddr *) &ss, &sz) < 0) {
		return (nni_plat_errno(errno));
	}
	return (nni_posix_sockaddr2nn(sa, &ss, sz));
}